

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O1

bool __thiscall
Clasp::Asp::LogicProgram::pushHead
          (LogicProgram *this,Head_t ht,AtomSpan *head,weight_t slack,RuleBuilder *out)

{
  AtomState *this_00;
  byte *pbVar1;
  size_t sVar2;
  uint *puVar3;
  Body_t BVar4;
  uint uVar5;
  WeightLit_t *pWVar6;
  WeightLit_t *pWVar7;
  Atom_t *pAVar8;
  byte bVar9;
  uint uVar10;
  byte bVar11;
  uint a;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  long lVar15;
  
  BVar4 = Potassco::RuleBuilder::bodyType(out);
  Potassco::RuleBuilder::start(out,ht);
  sVar2 = head->size;
  if (sVar2 == 0) {
    bVar14 = false;
    uVar12 = 0;
  }
  else {
    puVar3 = head->first;
    this_00 = &this->atomState_;
    lVar15 = 0;
    uVar10 = 0;
    bVar14 = false;
    do {
      a = *(uint *)((long)puVar3 + lVar15);
      uVar12 = (ulong)a;
      uVar13 = (this->atomState_).state_.ebo_.size;
      if ((a < uVar13) && (((this_00->state_).ebo_.buf[uVar12] & 0x7f) != 0)) {
        if ((uVar13 <= a) || (((this_00->state_).ebo_.buf[uVar12] & 0x44) == 0)) {
          uVar12 = uVar12 & 0x3fffffff;
          if ((uint)uVar12 < uVar13) {
            bVar9 = (this_00->state_).ebo_.buf[uVar12] & 1;
            bVar11 = ((this_00->state_).ebo_.buf[uVar12] & 2) >> 1;
          }
          else {
            bVar9 = 0;
            bVar11 = 0;
          }
          uVar13 = (uint)bVar9;
          if ((BVar4.val_ == Sum) && (bVar9 != 0)) {
            pWVar6 = Potassco::RuleBuilder::wlits_begin(out);
            pWVar7 = Potassco::RuleBuilder::wlits_end(out);
            pWVar6 = std::
                     __find_if<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_pred<Clasp::Asp::IsLit>>
                               (pWVar6,pWVar7,*(undefined4 *)((long)puVar3 + lVar15));
            uVar13 = pWVar6->weight;
          }
          uVar5 = (uint)bVar11;
          if ((BVar4.val_ == Sum) && (bVar11 != 0)) {
            pWVar6 = Potassco::RuleBuilder::wlits_begin(out);
            pWVar7 = Potassco::RuleBuilder::wlits_end(out);
            pWVar6 = std::
                     __find_if<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_pred<Clasp::Asp::IsLit>>
                               (pWVar6,pWVar7,-*(int *)((long)puVar3 + lVar15));
            uVar5 = pWVar6->weight;
          }
          a = *(uint *)((long)puVar3 + lVar15);
          if (a < (this->atomState_).state_.ebo_.size) {
            bVar9 = ((this_00->state_).ebo_.buf[a] & 0x20) >> 5;
          }
          else {
            bVar9 = 0;
          }
          if ((bVar9 == 0) && ((int)uVar13 <= slack)) {
            if ((int)uVar5 <= slack) goto LAB_00142a62;
          }
          else {
            bVar14 = true;
          }
        }
      }
      else {
LAB_00142a62:
        Potassco::RuleBuilder::addHead(out,a);
        AtomState::set(this_00,*(Var *)((long)puVar3 + lVar15),'\x04');
        uVar10 = uVar10 + 1;
      }
      lVar15 = lVar15 + 4;
    } while (sVar2 << 2 != lVar15);
    uVar12 = (ulong)uVar10;
  }
  pAVar8 = Potassco::RuleBuilder::head_begin(out);
  if ((int)uVar12 != 0) {
    lVar15 = 0;
    do {
      if (*(uint *)((long)pAVar8 + lVar15) < (this->atomState_).state_.ebo_.size) {
        pbVar1 = (this->atomState_).state_.ebo_.buf + *(uint *)((long)pAVar8 + lVar15);
        *pbVar1 = *pbVar1 & 0xe0;
      }
      lVar15 = lVar15 + 4;
    } while (uVar12 * 4 - lVar15 != 0);
  }
  return !bVar14 || (int)uVar12 != 0 && ht.val_ == Choice;
}

Assistant:

bool LogicProgram::pushHead(Head_t ht, const Potassco::AtomSpan& head, weight_t slack, RuleBuilder& out) {
	const uint8 ignoreMask = AtomState::false_flag|AtomState::head_flag;
	uint32 hs = 0;
	bool sat = false, sum = out.bodyType() == Body_t::Sum;
	out.start(ht);
	for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
		if (!atomState_.isSet(*it, AtomState::simp_mask)) {
			out.addHead(*it);
			atomState_.addToHead(*it);
			++hs;
		}
		else if (!atomState_.isSet(*it, ignoreMask)) { // h occurs in B+ and/or B- or is true
			weight_t wp = weight_t(atomState_.inBody(posLit(*it))), wn = weight_t(atomState_.inBody(negLit(*it)));
			if (wp && sum) { wp = std::find_if(out.wlits_begin(), out.wlits_end(), IsLit(Potassco::lit(*it)))->weight; }
			if (wn && sum) { wn = std::find_if(out.wlits_begin(), out.wlits_end(), IsLit(Potassco::neg(*it)))->weight; }
			if (atomState_.isFact(*it) || wp > slack) { sat = true; }
			else if (wn <= slack) {
				out.addHead(*it);
				atomState_.addToHead(*it);
				++hs;
			}
		}
	}
	for (const Atom_t* it = out.head_begin(), *end = it + hs; it != end; ++it) {
		atomState_.clearRule(*it);
	}
	return !sat || (ht == Head_t::Choice && hs);
}